

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_m68k_movec(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_ptr pTVar2;
  uint16_t uVar3;
  uint uVar4;
  int nargs;
  TCGv_i32 *ppTVar5;
  code *func;
  uintptr_t o;
  TCGTemp *ret;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_i32 local_38;
  
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = read_im16(env,s);
  if ((short)uVar3 < 0) {
    uVar4 = uVar3 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar4 & 1) == 0) {
      ppTVar5 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar5 = s->writeback;
    }
  }
  else {
    ppTVar5 = tcg_ctx->cpu_dregs;
    uVar4 = (uint)(uVar3 >> 0xc);
  }
  pTVar1 = ppTVar5[uVar4];
  pTVar2 = tcg_ctx->cpu_env;
  local_40 = tcg_const_i32_m68k(tcg_ctx,uVar3 & 0xfff);
  local_40 = local_40 + (long)tcg_ctx;
  if ((insn & 1) == 0) {
    ret = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
    func = helper_m68k_movec_from_m68k;
    nargs = 2;
  }
  else {
    local_38 = pTVar1 + (long)tcg_ctx;
    func = helper_m68k_movec_to_m68k;
    nargs = 3;
    ret = (TCGTemp *)0x0;
  }
  local_48 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  tcg_gen_callN_m68k(tcg_ctx,func,ret,nargs,&local_48);
  gen_exit_tb(s);
  return;
}

Assistant:

DISAS_INSN(m68k_movec)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv reg;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }

    ext = read_im16(env, s);

    if (ext & 0x8000) {
        reg = AREG(ext, 12);
    } else {
        reg = DREG(ext, 12);
    }
    if (insn & 1) {
        gen_helper_m68k_movec_to(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, ext & 0xfff), reg);
    } else {
        gen_helper_m68k_movec_from(tcg_ctx, reg, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, ext & 0xfff));
    }
    gen_exit_tb(s);
}